

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

smf_t * smf_new(void)

{
  smf_t *smf;
  GPtrArray *pGVar1;
  int *piVar2;
  char *pcVar3;
  
  smf = (smf_t *)calloc(1,0x50);
  if (smf == (smf_t *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    g_log("libsmf",8,"Cannot allocate smf_t structure: %s",pcVar3);
  }
  else {
    pGVar1 = (GPtrArray *)g_ptr_array_new();
    smf->tracks_array = pGVar1;
    if (pGVar1 == (GPtrArray *)0x0) {
      __assert_fail("smf->tracks_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x3f,"smf_t *smf_new(void)");
    }
    pGVar1 = (GPtrArray *)g_ptr_array_new();
    smf->tempo_array = pGVar1;
    if (pGVar1 == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x42,"smf_t *smf_new(void)");
    }
    smf->format = 0;
    smf->ppqn = 0x78;
    smf_init_tempo(smf);
  }
  return smf;
}

Assistant:

smf_t *
smf_new(void)
{
	int cantfail;

	smf_t *smf = malloc(sizeof(smf_t));
	if (smf == NULL) {
		g_critical("Cannot allocate smf_t structure: %s", strerror(errno));
		return (NULL);
	}

	memset(smf, 0, sizeof(smf_t));

	smf->tracks_array = g_ptr_array_new();
	assert(smf->tracks_array);

	smf->tempo_array = g_ptr_array_new();
	assert(smf->tempo_array);

	cantfail = smf_set_ppqn(smf, 120);
	assert(!cantfail);

	cantfail = smf_set_format(smf, 0);
	assert(!cantfail);

	smf_init_tempo(smf);

	return (smf);
}